

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
exe_reconstructor::sectioninfo::sectioninfo
          (sectioninfo *this,string *name,uint64_t size,ReadWriter_ptr *r)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->size = size;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>,
             &r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

sectioninfo(const std::string &name, uint64_t size, ReadWriter_ptr r)
            : name(name), size(size), r(r)
        {
        }